

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ngram.c
# Opt level: O0

void ReadUTF8_test(FILE *fp)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  uint32_t bow;
  uint32_t prob;
  int i_1;
  int order_1;
  size_t len;
  char *words [64];
  uint local_21c;
  ulong uStack_218;
  uint32_t i;
  size_t gram_nums [64];
  int order;
  FILE *fp_local;
  
  fgets(iobuf,200000,(FILE *)fp);
  gram_nums[0x3f]._4_4_ = atoi(iobuf);
  uVar1 = Ngram_order(ngram);
  if (uVar1 != gram_nums[0x3f]._4_4_) {
    __assert_fail("Ngram_order(ngram) == order",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                  ,0x1c,"void ReadUTF8_test(FILE *)");
  }
  local_21c = 0;
  while( true ) {
    if (gram_nums[0x3f]._4_4_ <= local_21c) {
      uVar1 = Ngram_word_num(ngram);
      if (uVar1 != uStack_218) {
        __assert_fail("Ngram_word_num(ngram) == gram_nums[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                      ,0x23,"void ReadUTF8_test(FILE *)");
      }
      while( true ) {
        pcVar6 = fgets(iobuf,200000,(FILE *)fp);
        if (pcVar6 == (char *)0x0) {
          return;
        }
        sVar7 = strlen(iobuf);
        if (*(char *)(sVar7 + 0x1090df) == '\n') {
          *(undefined1 *)(sVar7 + 0x1090df) = 0;
        }
        pcVar6 = strtok(iobuf,"\t");
        uVar1 = atoi(pcVar6);
        for (bow = 0; (int)bow < (int)uVar1; bow = bow + 1) {
          pcVar6 = strtok((char *)0x0,"\t");
          words[(long)(int)bow + -1] = pcVar6;
        }
        pcVar6 = strtok((char *)0x0,"\t");
        uVar2 = atoi(pcVar6);
        pcVar6 = strtok((char *)0x0,"\t");
        uVar3 = atoi(pcVar6);
        uVar4 = Ngram_prob2(ngram,(char **)&len,uVar1);
        if (uVar4 != uVar2) break;
        uVar1 = Ngram_bow2(ngram,(char **)&len,uVar1);
        if (uVar1 != uVar3) {
          __assert_fail("Ngram_bow2(ngram, (const char**)words,order) == bow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                        ,0x33,"void ReadUTF8_test(FILE *)");
        }
      }
      __assert_fail("Ngram_prob2(ngram,(const char**)words,order) == prob",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                    ,0x32,"void ReadUTF8_test(FILE *)");
    }
    fgets(iobuf,200000,(FILE *)fp);
    sVar5 = atol(iobuf);
    gram_nums[(ulong)local_21c - 1] = sVar5;
    sVar5 = Ngram_gram_num(ngram,local_21c + 1);
    if (sVar5 != gram_nums[(ulong)local_21c - 1]) break;
    local_21c = local_21c + 1;
  }
  __assert_fail("Ngram_gram_num(ngram, i+1) == gram_nums[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                ,0x21,"void ReadUTF8_test(FILE *)");
}

Assistant:

void ReadUTF8_test(FILE* fp)
{
    fgets((char*)iobuf, sizeof(iobuf), fp);
    int order = atoi(iobuf);
    assert(Ngram_order(ngram) == order);
    size_t gram_nums[MAX_ORDER];
    for (uint32_t i = 0;i<order;i++) {
         fgets((char*)iobuf, sizeof(iobuf), fp);
         gram_nums[i] = atol(iobuf);
         assert(Ngram_gram_num(ngram, i+1) == gram_nums[i]);
    }
    assert(Ngram_word_num(ngram) == gram_nums[0]);
    char* words[MAX_ORDER];
    while( fgets((char*)iobuf, sizeof(iobuf), fp))
    {
        size_t len = strlen(iobuf);
        if (iobuf[len-1] == '\n') {
            iobuf[len-1] = 0;
        }
        //order\tword\t...\tprob\tbow
        int order = atoi(strtok(iobuf, "\t"));
        for (int i = 0;i<order;i++) {
            words[i] = strtok(NULL,"\t");
        }
        uint32_t prob = atoi(strtok(NULL, "\t"));
        uint32_t bow = atoi(strtok(NULL, "\t"));
        assert(Ngram_prob2(ngram,(const char**)words,order) == prob);
        assert(Ngram_bow2(ngram, (const char**)words,order) == bow);
    }
}